

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int textureTarget,int mipLevel
          ,int imageIndex)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  ostringstream result;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"level ",6);
  std::ostream::operator<<(local_1a0,textureTarget);
  lVar2 = 0xb;
  iVar4 = (int)this;
  if (iVar4 == 0x806f) {
    pcVar3 = " and Slice ";
  }
  else if (iVar4 == 0x8513) {
    lVar2 = 10;
    pcVar3 = " and Face ";
  }
  else {
    if (iVar4 != 0x8c1a) goto LAB_01667298;
    pcVar3 = " and Layer ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,lVar2);
  std::ostream::operator<<(local_1a0,mipLevel);
LAB_01667298:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return psVar1;
}

Assistant:

string getTextureImageDescription (int textureTarget, int mipLevel, int imageIndex)
{
	std::ostringstream result;
	result << "level ";
	result << mipLevel;

	switch (textureTarget)
	{
		case GL_TEXTURE_2D:			break;
		case GL_TEXTURE_3D:			result << " and Slice " << imageIndex; break;
		case GL_TEXTURE_CUBE_MAP:	result << " and Face " << imageIndex; break;
		case GL_TEXTURE_2D_ARRAY:	result << " and Layer " << imageIndex; break;
		default:
			DE_FATAL("Unsupported texture target");
			break;
	}
	return result.str();
}